

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QDnsServiceRecordPrivate>::reset
          (QSharedDataPointer<QDnsServiceRecordPrivate> *this,QDnsServiceRecordPrivate *ptr)

{
  QDnsServiceRecordPrivate *this_00;
  
  this_00 = (this->d).ptr;
  if (this_00 != ptr) {
    if (ptr != (QDnsServiceRecordPrivate *)0x0) {
      LOCK();
      (ptr->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (ptr->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
      UNLOCK();
      this_00 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (this_00 != (QDnsServiceRecordPrivate *)0x0) {
      LOCK();
      (this_00->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (this_00->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (this_00->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        QDnsServiceRecordPrivate::~QDnsServiceRecordPrivate(this_00);
        operator_delete(this_00,0x48);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }